

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O3

XrFormFactor GetXrFormFactor(string *formFactorStr)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  char cVar3;
  char cVar4;
  XrFormFactor XVar5;
  ctype *pcVar6;
  invalid_argument *this;
  long lVar7;
  bool bVar8;
  bool bVar9;
  locale alStack_68 [8];
  string local_60;
  pointer local_40;
  string *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Hmd","");
  std::locale::locale(alStack_68);
  pcVar6 = std::use_facet<std::ctype<char>>(alStack_68);
  _Var2._M_p = local_60._M_dataplus._M_p;
  sVar1 = formFactorStr->_M_string_length;
  local_38 = formFactorStr;
  if (sVar1 == local_60._M_string_length) {
    if (sVar1 == 0) {
      bVar8 = true;
    }
    else {
      local_40 = (formFactorStr->_M_dataplus)._M_p;
      lVar7 = 0;
      do {
        cVar4 = _Var2._M_p[lVar7];
        cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_40[lVar7]);
        cVar4 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar4);
        bVar8 = cVar3 == cVar4;
        if (!bVar8) break;
        bVar9 = sVar1 - 1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar9);
    }
  }
  else {
    bVar8 = false;
  }
  std::locale::~locale(alStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  XVar5 = XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
  if (!bVar8) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Handheld","");
    std::locale::locale(alStack_68);
    pcVar6 = std::use_facet<std::ctype<char>>(alStack_68);
    _Var2._M_p = local_60._M_dataplus._M_p;
    sVar1 = local_38->_M_string_length;
    if (sVar1 == local_60._M_string_length) {
      if (sVar1 == 0) {
        bVar8 = true;
      }
      else {
        local_40 = (local_38->_M_dataplus)._M_p;
        lVar7 = 0;
        do {
          cVar4 = _Var2._M_p[lVar7];
          cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)local_40[lVar7]);
          cVar4 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar4);
          bVar8 = cVar3 == cVar4;
          if (!bVar8) break;
          bVar9 = sVar1 - 1 != lVar7;
          lVar7 = lVar7 + 1;
        } while (bVar9);
      }
    }
    else {
      bVar8 = false;
    }
    std::locale::~locale(alStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    XVar5 = XR_FORM_FACTOR_HANDHELD_DISPLAY;
    if (!bVar8) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      Fmt_abi_cxx11_(&local_60,"Unknown form factor \'%s\'",(local_38->_M_dataplus)._M_p);
      std::invalid_argument::invalid_argument(this,(string *)&local_60);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return XVar5;
}

Assistant:

inline XrFormFactor GetXrFormFactor(const std::string& formFactorStr) {
    if (EqualsIgnoreCase(formFactorStr, "Hmd")) {
        return XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY;
    }
    if (EqualsIgnoreCase(formFactorStr, "Handheld")) {
        return XR_FORM_FACTOR_HANDHELD_DISPLAY;
    }
    throw std::invalid_argument(Fmt("Unknown form factor '%s'", formFactorStr.c_str()));
}